

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::readI<(moira::Core)0,2>(Moira *this)

{
  ushort uVar1;
  u32 result;
  Moira *this_local;
  
  uVar1 = (this->queue).irc;
  readExt<(moira::Core)0>(this);
  this->readBuffer = (this->queue).irc;
  return (uint)uVar1;
}

Assistant:

u32
Moira::readI()
{
    u32 result;

    switch (S) {

        case Byte:

            result = (u8)queue.irc;
            readExt<C>();
            break;

        case Word:

            result = queue.irc;
            readExt<C>();
            break;

        case Long:

            result = queue.irc << 16;
            readExt<C>();
            result |= queue.irc;
            readExt<C>();
            break;

        default:
            fatalError;
    }
    readBuffer = queue.irc;

    return result;
}